

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::baggage::Baggage_testRemoteRestrictionManagerDefaults_Test::TestBody
          (Baggage_testRemoteRestrictionManagerDefaults_Test *this)

{
  AssertionResult *pAVar1;
  char *pcVar2;
  allocator local_1f2;
  allocator local_1f1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1c0 [4];
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  Logger *local_198;
  Restriction local_190;
  Restriction local_188;
  RemoteRestrictionManager manager;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8 [23];
  
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  std::__cxx11::string::string((string *)&gtest_ar,"test-service",(allocator *)&local_190);
  pcVar2 = "";
  std::__cxx11::string::string((string *)local_1c0,"",(allocator *)&local_188);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0;
  jaegertracing::baggage::RemoteRestrictionManager::RemoteRestrictionManager
            (&manager,(string *)&gtest_ar,(string *)local_1c0,false,(duration *)&gtest_ar_1,
             local_198,
             (Metrics *)
             metrics._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_1c0[0].__r = 60000000000;
  testing::internal::
  CmpHelperEQ<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((internal *)&gtest_ar,"RemoteRestrictionManager::defaultRefreshInterval()",
             "manager.refreshInterval()",local_1c0,local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1c0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)local_1c0);
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1c0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_190._keyAllowed = true;
    local_190._maxValueLength = 0x800;
    std::__cxx11::string::string((string *)&gtest_ar,"test-service",&local_1f1);
    std::__cxx11::string::string((string *)local_1c0,"abc",&local_1f2);
    local_188 = (Restriction)
                jaegertracing::baggage::RemoteRestrictionManager::getRestriction
                          ((string *)&manager,(string *)&gtest_ar);
    testing::internal::
    CmpHelperEQ<jaegertracing::baggage::Restriction,jaegertracing::baggage::Restriction>
              ((internal *)&gtest_ar_1,
               "Restriction(true, RemoteRestrictionManager::kDefaultMaxValueLength)",
               "manager.getRestriction(\"test-service\", \"abc\")",&local_190,&local_188);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                 ,0x8a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1c0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    pAVar1 = &gtest_ar_1;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  RemoteRestrictionManager::~RemoteRestrictionManager(&manager);
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&metrics);
  if (local_198 != (Logger *)0x0) {
    (*local_198->_vptr_Logger[1])();
  }
  return;
}

Assistant:

TEST(Baggage, testRemoteRestrictionManagerDefaults)
{
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    RemoteRestrictionManager manager(
        "test-service",
        "",
        false,
        RemoteRestrictionManager::Clock::duration(),
        *logger,
        *metrics);
    ASSERT_EQ(RemoteRestrictionManager::defaultRefreshInterval(),
              manager.refreshInterval());
    ASSERT_EQ(
        Restriction(true, RemoteRestrictionManager::kDefaultMaxValueLength),
        manager.getRestriction("test-service", "abc"));
}